

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

duckdb * __thiscall
duckdb::GetGenericTimePartFunction
          (duckdb *this,LogicalType *result_type,scalar_function_t *date_func,
          scalar_function_t *ts_func,scalar_function_t *interval_func,scalar_function_t *time_func,
          scalar_function_t timetz_func,function_statistics_t date_stats,
          function_statistics_t ts_stats,function_statistics_t time_stats,
          function_statistics_t timetz_stats)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this_00;
  _Manager_type p_Var1;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  allocator_type local_821;
  LogicalType local_820 [24];
  _Any_data local_808;
  long local_7f8;
  undefined8 local_7f0;
  _Any_data local_7e8;
  _Manager_type local_7d8;
  _Invoker_type local_7d0;
  _Any_data local_7c8;
  _Manager_type local_7b8;
  _Invoker_type local_7b0;
  _Any_data local_7a8;
  _Manager_type local_798;
  _Invoker_type local_790;
  _Any_data local_788;
  _Manager_type local_778;
  _Invoker_type local_770;
  LogicalType local_760 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_748;
  LogicalType local_730 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_718;
  LogicalType local_700 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6e8;
  LogicalType local_6d0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_6b8;
  LogicalType local_6a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670 [24];
  LogicalType local_658 [24];
  LogicalType local_640 [24];
  LogicalType local_628 [24];
  LogicalType local_610 [24];
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)this);
  duckdb::LogicalType::LogicalType(local_820,DATE);
  __l._M_len = 1;
  __l._M_array = local_820;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l,&local_821);
  duckdb::LogicalType::LogicalType(local_6a0,result_type);
  local_788._M_unused._M_object = (void *)0x0;
  local_788._8_8_ = 0;
  local_778 = (_Manager_type)0x0;
  local_770 = date_func->_M_invoker;
  p_Var1 = (date_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_788._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(date_func->super__Function_base)._M_functor;
    local_788._8_8_ = *(undefined8 *)((long)&(date_func->super__Function_base)._M_functor + 8);
    (date_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    date_func->_M_invoker = (_Invoker_type)0x0;
    local_778 = p_Var1;
  }
  duckdb::LogicalType::LogicalType(local_610,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_688,local_6a0,&local_788,0,0,
             timetz_func.super__Function_base._M_functor._8_8_,0,local_610,0,0,0);
  this_00 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)(this + 0x20)
  ;
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this_00,&local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  duckdb::LogicalType::~LogicalType(local_610);
  std::_Function_base::~_Function_base((_Function_base *)&local_788);
  duckdb::LogicalType::~LogicalType(local_6a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  duckdb::LogicalType::~LogicalType(local_820);
  duckdb::LogicalType::LogicalType(local_820,TIMESTAMP);
  __l_00._M_len = 1;
  __l_00._M_array = local_820;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6b8,__l_00,&local_821);
  duckdb::LogicalType::LogicalType(local_6d0,result_type);
  local_7a8._M_unused._M_object = (void *)0x0;
  local_7a8._8_8_ = 0;
  local_798 = (_Manager_type)0x0;
  local_790 = ts_func->_M_invoker;
  p_Var1 = (ts_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_7a8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(ts_func->super__Function_base)._M_functor;
    local_7a8._8_8_ = *(undefined8 *)((long)&(ts_func->super__Function_base)._M_functor + 8);
    (ts_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    ts_func->_M_invoker = (_Invoker_type)0x0;
    local_798 = p_Var1;
  }
  duckdb::LogicalType::LogicalType(local_628,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_6b8,local_6d0,&local_7a8,0,0,
             timetz_func.super__Function_base._M_manager,0,local_628,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this_00,&local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  duckdb::LogicalType::~LogicalType(local_628);
  std::_Function_base::~_Function_base((_Function_base *)&local_7a8);
  duckdb::LogicalType::~LogicalType(local_6d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6b8);
  duckdb::LogicalType::~LogicalType(local_820);
  duckdb::LogicalType::LogicalType(local_820,INTERVAL);
  __l_01._M_len = 1;
  __l_01._M_array = local_820;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_6e8,__l_01,&local_821);
  duckdb::LogicalType::LogicalType(local_700,result_type);
  local_7c8._M_unused._M_object = (void *)0x0;
  local_7c8._8_8_ = 0;
  local_7b8 = (_Manager_type)0x0;
  local_7b0 = interval_func->_M_invoker;
  p_Var1 = (interval_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_7c8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(interval_func->super__Function_base)._M_functor;
    local_7c8._8_8_ = *(undefined8 *)((long)&(interval_func->super__Function_base)._M_functor + 8);
    (interval_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    interval_func->_M_invoker = (_Invoker_type)0x0;
    local_7b8 = p_Var1;
  }
  duckdb::LogicalType::LogicalType(local_640,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a8,&local_6e8,local_700,&local_7c8,0,0,0,0,local_640,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this_00,&local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  duckdb::LogicalType::~LogicalType(local_640);
  std::_Function_base::~_Function_base((_Function_base *)&local_7c8);
  duckdb::LogicalType::~LogicalType(local_700);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_6e8);
  duckdb::LogicalType::~LogicalType(local_820);
  duckdb::LogicalType::LogicalType(local_820,TIME);
  __l_02._M_len = 1;
  __l_02._M_array = local_820;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_718,__l_02,&local_821);
  duckdb::LogicalType::LogicalType(local_730,result_type);
  local_7e8._M_unused._M_object = (void *)0x0;
  local_7e8._8_8_ = 0;
  local_7d8 = (_Manager_type)0x0;
  local_7d0 = time_func->_M_invoker;
  p_Var1 = (time_func->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_7e8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(time_func->super__Function_base)._M_functor;
    local_7e8._8_8_ = *(undefined8 *)((long)&(time_func->super__Function_base)._M_functor + 8);
    (time_func->super__Function_base)._M_manager = (_Manager_type)0x0;
    time_func->_M_invoker = (_Invoker_type)0x0;
    local_7d8 = p_Var1;
  }
  duckdb::LogicalType::LogicalType(local_658,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_4d0,&local_718,local_730,&local_7e8,0,0,timetz_func._M_invoker,0,local_658,0,0,0
            );
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this_00,&local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  duckdb::LogicalType::~LogicalType(local_658);
  std::_Function_base::~_Function_base((_Function_base *)&local_7e8);
  duckdb::LogicalType::~LogicalType(local_730);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_718);
  duckdb::LogicalType::~LogicalType(local_820);
  duckdb::LogicalType::LogicalType(local_820,TIME_TZ);
  __l_03._M_len = 1;
  __l_03._M_array = local_820;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_748,__l_03,&local_821);
  duckdb::LogicalType::LogicalType(local_760,result_type);
  local_808._M_unused._M_object = (void *)0x0;
  local_808._8_8_ = 0;
  local_7f8 = 0;
  local_7f0 = *(undefined8 *)
               (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18);
  lVar2 = *(long *)(timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10
                   );
  if (lVar2 != 0) {
    local_808._M_unused._0_8_ =
         (undefined8)*timetz_func.super__Function_base._M_functor._M_unused._M_object;
    local_808._8_8_ =
         *(undefined8 *)
          (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
    *(undefined8 *)
     (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) = 0;
    *(undefined8 *)
     (timetz_func.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18) = 0;
    local_7f8 = lVar2;
  }
  duckdb::LogicalType::LogicalType(local_670,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f8,&local_748,local_760,&local_808,0,0,date_stats,0,local_670,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this_00,&local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  duckdb::LogicalType::~LogicalType(local_670);
  std::_Function_base::~_Function_base((_Function_base *)&local_808);
  duckdb::LogicalType::~LogicalType(local_760);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_748);
  duckdb::LogicalType::~LogicalType(local_820);
  return this;
}

Assistant:

ScalarFunctionSet GetGenericTimePartFunction(const LogicalType &result_type, scalar_function_t date_func,
                                             scalar_function_t ts_func, scalar_function_t interval_func,
                                             scalar_function_t time_func, scalar_function_t timetz_func,
                                             function_statistics_t date_stats, function_statistics_t ts_stats,
                                             function_statistics_t time_stats, function_statistics_t timetz_stats) {
	ScalarFunctionSet operator_set;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::DATE}, result_type, std::move(date_func), nullptr, nullptr, date_stats));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP}, result_type, std::move(ts_func), nullptr, nullptr, ts_stats));
	operator_set.AddFunction(ScalarFunction({LogicalType::INTERVAL}, result_type, std::move(interval_func)));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIME}, result_type, std::move(time_func), nullptr, nullptr, time_stats));
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIME_TZ}, result_type, std::move(timetz_func), nullptr, nullptr, timetz_stats));
	return operator_set;
}